

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O2

vorbis_look_residue * res0_look(vorbis_dsp_state *vd,vorbis_info_residue *vr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  
  puVar5 = (undefined8 *)calloc(1,0x50);
  pvVar10 = vd->vi->codec_setup;
  *puVar5 = vr;
  uVar1 = *(uint *)((long)vr + 0x14);
  *(uint *)(puVar5 + 1) = uVar1;
  lVar13 = *(long *)((long)pvVar10 + 0x1328);
  puVar5[2] = lVar13;
  lVar11 = (long)*(int *)((long)vr + 0x1c) * 0x60;
  puVar5[3] = lVar13 + lVar11;
  uVar15 = *(ulong *)(lVar13 + lVar11);
  pvVar6 = calloc((long)(int)uVar1,8);
  puVar5[4] = pvVar6;
  uVar14 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  iVar16 = 0;
  uVar2 = 0;
  for (; uVar14 != uVar7; uVar14 = uVar14 + 1) {
    uVar3 = ov_ilog(*(ogg_uint32_t *)((long)vr + uVar14 * 4 + 0x20));
    if (uVar3 != 0) {
      pvVar8 = calloc((long)(int)uVar3,8);
      *(void **)((long)pvVar6 + uVar14 * 8) = pvVar8;
      uVar9 = 0;
      if (0 < (int)uVar3) {
        uVar9 = (ulong)uVar3;
      }
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        if ((*(uint *)((long)vr + uVar14 * 4 + 0x20) >> ((uint)uVar12 & 0x1f) & 1) != 0) {
          lVar13 = (long)iVar16;
          iVar16 = iVar16 + 1;
          *(long *)(*(long *)((long)pvVar6 + uVar14 * 8) + uVar12 * 8) =
               (long)*(int *)((long)vr + lVar13 * 4 + 0x120) * 0x60 +
               *(long *)((long)pvVar10 + 0x1328);
        }
      }
      if ((int)uVar2 < (int)uVar3) {
        uVar2 = uVar3;
      }
    }
  }
  *(undefined4 *)(puVar5 + 5) = 1;
  uVar7 = 0;
  iVar16 = (int)uVar15;
  if (0 < iVar16) {
    uVar7 = uVar15 & 0xffffffff;
  }
  uVar3 = 1;
  uVar15 = uVar7;
  while (iVar4 = (int)uVar15, uVar15 = (ulong)(iVar4 - 1), iVar4 != 0) {
    uVar3 = uVar3 * uVar1;
    *(uint *)(puVar5 + 5) = uVar3;
  }
  *(uint *)((long)puVar5 + 0xc) = uVar2;
  pvVar10 = malloc((long)(int)uVar3 * 8);
  puVar5[6] = pvVar10;
  uVar15 = 0;
  uVar14 = 0;
  if (0 < (int)uVar3) {
    uVar14 = (ulong)uVar3;
  }
  for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
    lVar13 = (long)((int)uVar3 / (int)uVar1);
    pvVar6 = malloc((long)iVar16 << 2);
    *(void **)((long)pvVar10 + uVar15 * 8) = pvVar6;
    uVar9 = uVar15;
    for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
      lVar11 = (long)uVar9 / lVar13;
      uVar9 = (long)uVar9 % lVar13;
      lVar13 = lVar13 / (long)(int)uVar1;
      *(int *)((long)pvVar6 + uVar12 * 4) = (int)lVar11;
    }
  }
  return puVar5;
}

Assistant:

vorbis_look_residue *res0_look(vorbis_dsp_state *vd,
                               vorbis_info_residue *vr){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  vorbis_look_residue0 *look=_ogg_calloc(1,sizeof(*look));
  codec_setup_info     *ci=vd->vi->codec_setup;

  int j,k,acc=0;
  int dim;
  int maxstage=0;
  look->info=info;

  look->parts=info->partitions;
  look->fullbooks=ci->fullbooks;
  look->phrasebook=ci->fullbooks+info->groupbook;
  dim=look->phrasebook->dim;

  look->partbooks=_ogg_calloc(look->parts,sizeof(*look->partbooks));

  for(j=0;j<look->parts;j++){
    int stages=ov_ilog(info->secondstages[j]);
    if(stages){
      if(stages>maxstage)maxstage=stages;
      look->partbooks[j]=_ogg_calloc(stages,sizeof(*look->partbooks[j]));
      for(k=0;k<stages;k++)
        if(info->secondstages[j]&(1<<k)){
          look->partbooks[j][k]=ci->fullbooks+info->booklist[acc++];
#ifdef TRAIN_RES
          look->training_data[k][j]=_ogg_calloc(look->partbooks[j][k]->entries,
                                           sizeof(***look->training_data));
#endif
        }
    }
  }

  look->partvals=1;
  for(j=0;j<dim;j++)
      look->partvals*=look->parts;

  look->stages=maxstage;
  look->decodemap=_ogg_malloc(look->partvals*sizeof(*look->decodemap));
  for(j=0;j<look->partvals;j++){
    long val=j;
    long mult=look->partvals/look->parts;
    look->decodemap[j]=_ogg_malloc(dim*sizeof(*look->decodemap[j]));
    for(k=0;k<dim;k++){
      long deco=val/mult;
      val-=deco*mult;
      mult/=look->parts;
      look->decodemap[j][k]=deco;
    }
  }
#if defined(TRAIN_RES) || defined (TRAIN_RESAUX)
  {
    static int train_seq=0;
    look->train_seq=train_seq++;
  }
#endif
  return(look);
}